

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::OneofDescriptorProto::_InternalParse
          (OneofDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  OneofOptions *pOVar5;
  uint32 res;
  uint tag;
  byte *p;
  Arena *pAVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  this_00 = &this->name_;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar8._8_8_ = 0;
      pVar8.first = ptr;
    }
    else {
      pVar8._8_8_ = 1;
      pVar8.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar8 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar8.first;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar7.second._0_1_ = bVar1;
    pVar7.first = (char *)(p + 1);
    pVar7._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar7.second = res;
        pVar7.first = (char *)(p + 2);
        pVar7._12_4_ = 0;
      }
    }
    ptr = pVar7.first;
    if (ptr == (char *)0x0) {
      cVar3 = '\x04';
    }
    else {
      tag = pVar7.second;
      uVar4 = (uint)(pVar7._8_8_ >> 3) & 0x1fffffff;
      if (uVar4 == 2) {
        if ((char)pVar7.second != '\x12') goto LAB_002f9ca4;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->options_ == (OneofOptions *)0x0) {
          pAVar6 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar6 & 1) != 0) {
            pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
          }
          pOVar5 = Arena::CreateMaybeMessage<google::protobuf::OneofOptions>(pAVar6);
          this->options_ = pOVar5;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::OneofOptions>
                        (ctx,this->options_,ptr);
      }
      else if ((uVar4 == 1) && ((char)pVar7.second == '\n')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar6 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
        }
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
      }
      else {
LAB_002f9ca4:
        if (tag == 0 || (tag & 7) == 4) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
          cVar3 = '\a';
          goto LAB_002f9ce6;
        }
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
      }
      cVar3 = (ptr == (char *)0x0) * '\x02' + '\x02';
    }
LAB_002f9ce6:
    if (cVar3 != '\x02') {
      if (cVar3 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* OneofDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.OneofDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.OneofOptions options = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}